

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TalksDB.cpp
# Opt level: O1

TalkRef * __thiscall
cppti::TalksDB::talkRefFromTalk(TalkRef *__return_storage_ptr__,TalksDB *this,Talk *talk)

{
  pointer *ppSVar1;
  pointer pcVar2;
  iterator __position;
  pointer pbVar3;
  ulong uVar4;
  Talk *pTVar5;
  int iVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  difference_type __d;
  ulong uVar8;
  pointer pSVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tag;
  pointer pbVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id;
  string local_80;
  Talk *local_60;
  pointer local_58;
  Speaker local_50;
  
  (__return_storage_ptr__->speakers).
  super__Vector_base<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->speakers).
  super__Vector_base<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->speakers).
  super__Vector_base<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->title)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->title).field_2;
  (__return_storage_ptr__->title)._M_string_length = 0;
  (__return_storage_ptr__->title).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->slides).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  (__return_storage_ptr__->conference)._M_len = 0;
  (__return_storage_ptr__->conference)._M_str = (char *)0x0;
  __return_storage_ptr__->year = 0;
  (__return_storage_ptr__->link)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->link).field_2
  ;
  (__return_storage_ptr__->link)._M_string_length = 0;
  (__return_storage_ptr__->link).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->tags).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->tags).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->tags).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>::
  reserve(&__return_storage_ptr__->speakers,
          (long)(talk->speakers).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(talk->speakers).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar10 = (talk->speakers).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (talk->speakers).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = talk;
  if (pbVar10 != local_58) {
    do {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      pcVar2 = (pbVar10->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar2,pcVar2 + pbVar10->_M_string_length);
      toSnakeCase(&local_80);
      pSVar9 = (this->speakers).
               super__Vector_base<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(this->speakers).
                    super__Vector_base<cppti::TalksDB::Speaker,_std::allocator<cppti::TalksDB::Speaker>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar9 >> 6;
      while (uVar4 = uVar8, 0 < (long)uVar4) {
        uVar8 = uVar4 >> 1;
        iVar6 = std::__cxx11::string::compare((string *)(pSVar9 + uVar8));
        if (iVar6 < 0) {
          pSVar9 = pSVar9 + uVar8 + 1;
          uVar8 = ~uVar8 + uVar4;
        }
      }
      local_50.id._M_str = (pSVar9->id)._M_dataplus._M_p;
      local_50.id._M_len = (pSVar9->id)._M_string_length;
      local_50.display_name._M_str = (pSVar9->display_name)._M_dataplus._M_p;
      local_50.display_name._M_len = (pSVar9->display_name)._M_string_length;
      __position._M_current =
           (__return_storage_ptr__->speakers).
           super__Vector_base<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->speakers).
          super__Vector_base<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>
        ::_M_realloc_insert<cppti::TalksDB::TalkRef::Speaker>
                  (&__return_storage_ptr__->speakers,__position,&local_50);
      }
      else {
        ((__position._M_current)->display_name)._M_len = local_50.display_name._M_len;
        ((__position._M_current)->display_name)._M_str = local_50.display_name._M_str;
        ((__position._M_current)->id)._M_len = local_50.id._M_len;
        ((__position._M_current)->id)._M_str = local_50.id._M_str;
        ppSVar1 = &(__return_storage_ptr__->speakers).
                   super__Vector_base<cppti::TalksDB::TalkRef::Speaker,_std::allocator<cppti::TalksDB::TalkRef::Speaker>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != local_58);
  }
  pTVar5 = local_60;
  _Var7 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string,__gnu_cxx::__ops::_Iter_less_val>
                    ((this->conferences).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->conferences).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_60->conference);
  pcVar2 = ((_Var7._M_current)->_M_dataplus)._M_p;
  (__return_storage_ptr__->conference)._M_len = (_Var7._M_current)->_M_string_length;
  (__return_storage_ptr__->conference)._M_str = pcVar2;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::reserve(&__return_storage_ptr__->tags,
            (long)(pTVar5->tags).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pTVar5->tags).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar3 = (pTVar5->tags).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar10 = (pTVar5->tags).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar3; pbVar10 = pbVar10 + 1
      ) {
    _Var7 = std::
            __lower_bound<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string,__gnu_cxx::__ops::_Iter_less_val>
                      ((this->tags).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->tags).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,pbVar10);
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<std::__cxx11::string&>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)&__return_storage_ptr__->tags,_Var7._M_current);
  }
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->title);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_copy_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&__return_storage_ptr__->slides,
                   (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pTVar5->slides);
  __return_storage_ptr__->year = pTVar5->year;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->link);
  return __return_storage_ptr__;
}

Assistant:

TalksDB::TalkRef TalksDB::talkRefFromTalk(Talk const& talk)
{
  auto ret = TalkRef{};

  ret.speakers.reserve(talk.speakers.size());
  for (auto const& speaker : talk.speakers)
  {
    auto id = speaker;
    toSnakeCase(id);
    auto const& index_speaker = *std::lower_bound(
        this->speakers.begin(),
        this->speakers.end(),
        id,
        [&](auto const& hay, auto const& needle) { return hay.id < needle; });
    ret.speakers.emplace_back(
        TalkRef::Speaker{index_speaker.id, index_speaker.display_name});
  }

  ret.conference = *std::lower_bound(
      this->conferences.begin(), this->conferences.end(), talk.conference);

  ret.tags.reserve(talk.tags.size());
  for (auto const& tag : talk.tags)
    ret.tags.emplace_back(
        *std::lower_bound(this->tags.begin(), this->tags.end(), tag));

  ret.title = talk.title;
  ret.slides = talk.slides;
  ret.year = talk.year;
  ret.link = talk.link;
  return ret;
}